

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetector::MemoryLeakDetector(MemoryLeakDetector *this,MemoryLeakFailure *reporter)

{
  SimpleMutex *this_00;
  
  this->_vptr_MemoryLeakDetector = (_func_int **)&PTR__MemoryLeakDetector_0012c280;
  (this->outputBuffer_).total_leaks_ = 0;
  (this->outputBuffer_).giveWarningOnUsingMalloc_ = false;
  (this->outputBuffer_).outputBuffer_.positions_filled_ = 0;
  (this->outputBuffer_).outputBuffer_.write_limit_ = 0xfff;
  (this->outputBuffer_).outputBuffer_.buffer_[0] = '\0';
  memset(&this->memoryTable_,0,0x248);
  this->doAllocationTypeChecking_ = true;
  this->allocationSequenceNumber_ = 1;
  this->current_period_ = mem_leak_period_disabled;
  this->current_allocation_stage_ = '\0';
  this->reporter_ = reporter;
  this_00 = (SimpleMutex *)
            operator_new(8,
                         "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O3/_deps/cpputest-src/src/CppUTest/MemoryLeakDetector.cpp"
                         ,0x1da);
  SimpleMutex::SimpleMutex(this_00);
  this->mutex_ = this_00;
  return;
}

Assistant:

MemoryLeakDetector::MemoryLeakDetector(MemoryLeakFailure* reporter)
{
    doAllocationTypeChecking_ = true;
    allocationSequenceNumber_ = 1;
    current_period_ = mem_leak_period_disabled;
    current_allocation_stage_ = 0;
    reporter_ = reporter;
    mutex_ = new SimpleMutex;
}